

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

char * __thiscall leveldb::Arena::AllocateFallback(Arena *this,size_t bytes)

{
  long lVar1;
  char *pcVar2;
  ulong in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  char *result;
  char *result_1;
  size_t in_stack_ffffffffffffffd0;
  Arena *in_stack_ffffffffffffffd8;
  char *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI < 0x401) {
    pcVar2 = AllocateNewBlock(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    *in_RDI = (long)pcVar2;
    in_RDI[1] = 0x1000;
    local_10 = (char *)*in_RDI;
    *in_RDI = in_RSI + *in_RDI;
    in_RDI[1] = in_RDI[1] - in_RSI;
  }
  else {
    local_10 = AllocateNewBlock(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

char* Arena::AllocateFallback(size_t bytes) {
  if (bytes > kBlockSize / 4) {
    // Object is more than a quarter of our block size.  Allocate it separately
    // to avoid wasting too much space in leftover bytes.
    char* result = AllocateNewBlock(bytes);
    return result;
  }

  // We waste the remaining space in the current block.
  alloc_ptr_ = AllocateNewBlock(kBlockSize);
  alloc_bytes_remaining_ = kBlockSize;

  char* result = alloc_ptr_;
  alloc_ptr_ += bytes;
  alloc_bytes_remaining_ -= bytes;
  return result;
}